

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

int util::str_value<int>(string *str)

{
  size_t sVar1;
  bool bVar2;
  size_t sVar3;
  exception *this;
  int __base;
  char (*in_R8) [2];
  string local_90;
  int local_70;
  int n;
  string local_60;
  string local_40;
  undefined1 local_19;
  size_t sStack_18;
  bool hex;
  size_t idx_end;
  string *str_local;
  
  sStack_18 = 0;
  idx_end = (size_t)str;
  std::__cxx11::string::substr((ulong)&local_60,(ulong)str);
  lowercase(&local_40,&local_60);
  bVar2 = std::operator==(&local_40,"0x");
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  local_70 = 0;
  __base = 10;
  if (bVar2) {
    __base = 0x10;
  }
  local_19 = bVar2;
  local_70 = std::__cxx11::stoi((string *)idx_end,&stack0xffffffffffffffe8,__base);
  sVar1 = sStack_18;
  sVar3 = std::__cxx11::string::size();
  if ((sVar1 == sVar3) && (-1 < local_70)) {
    return local_70;
  }
  this = (exception *)__cxa_allocate_exception(0x10);
  format<char_const*,std::__cxx11::string_const&,char_const(&)[2]>
            (&local_90,(util *)"invalid value \'",(char *)idx_end,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2a9ff7,in_R8);
  exception::exception<std::__cxx11::string>(this,&local_90);
  __cxa_throw(this,&exception::typeinfo,exception::~exception);
}

Assistant:

T str_value(const std::string& str)
{
    static_assert(std::is_same<T, int>::value || std::is_same<T, long>::value, "int or long only");
    try
    {
        size_t idx_end = 0;
        auto hex = util::lowercase(str.substr(0, 2)) == "0x";
        T n{};
        if (std::is_same<T, int>::value)
            n = std::stoi(str, &idx_end, hex ? 16 : 10);
        else
            n = std::stol(str, &idx_end, hex ? 16 : 10);
        if (idx_end == str.size() && n >= 0)
            return n;
    }
    catch (...)
    {
    }

    throw util::exception(util::format("invalid value '", str, "'"));
}